

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O3

void __thiscall xmrig::Miner::setJob(Miner *this,Job *job)

{
  pointer ppIVar1;
  bool bVar2;
  int iVar3;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  MinerPrivate *pMVar4;
  pointer ppIVar5;
  
  ppIVar1 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar5 = (this->d_ptr->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar5 != ppIVar1; ppIVar5 = ppIVar5 + 1) {
    (*(*ppIVar5)->_vptr_IBackend[7])(*ppIVar5,job);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pMVar4 = this->d_ptr;
  bVar2 = true;
  src = extraout_RDX;
  if ((pMVar4->job).m_index == '\x01') {
    bVar2 = String::isEqual(&pMVar4->userJobId,&job->m_id);
    bVar2 = !bVar2;
    pMVar4 = this->d_ptr;
    src = extraout_RDX_00;
  }
  pMVar4->reset = bVar2;
  Job::copy(&pMVar4->job,(EVP_PKEY_CTX *)job,src);
  pMVar4 = this->d_ptr;
  (pMVar4->job).m_index = '\0';
  String::copy(&pMVar4->userJobId,(EVP_PKEY_CTX *)&job->m_id,src_00);
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  pMVar4 = this->d_ptr;
  pMVar4->active = true;
  if (pMVar4->reset == true) {
    Nonce::reset((pMVar4->job).m_index);
  }
  ppIVar5 = (pMVar4->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (pMVar4->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar5 != ppIVar1) {
    do {
      (*(*ppIVar5)->_vptr_IBackend[9])(*ppIVar5,&pMVar4->job);
      ppIVar5 = ppIVar5 + 1;
    } while (ppIVar5 != ppIVar1);
  }
  Nonce::touch();
  if (pMVar4->enabled != false) {
    LOCK();
    Nonce::m_paused = 0;
    UNLOCK();
  }
  if (pMVar4->ticks != 0) {
    return;
  }
  pMVar4->ticks = 1;
  Timer::start(pMVar4->timer,500,500);
  return;
}

Assistant:

void xmrig::Miner::setJob(const Job &job)
{
    for (IBackend *backend : d_ptr->backends) {
        backend->prepare(job);
    }

    mutex.lock();

    const uint8_t index = 0;

    d_ptr->reset = !(d_ptr->job.index() == 1 && index == 0 && d_ptr->userJobId == job.id());
    d_ptr->job   = job;
    d_ptr->job.setIndex(index);

    if (index == 0) {
        d_ptr->userJobId = job.id();
    }

    mutex.unlock();
    d_ptr->handleJobChange();
}